

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilterBase.cpp
# Opt level: O2

void __thiscall
UnscentedKalmanFilterBase_computeSigmaWeights_Test::
~UnscentedKalmanFilterBase_computeSigmaWeights_Test
          (UnscentedKalmanFilterBase_computeSigmaWeights_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(UnscentedKalmanFilterBase, computeSigmaWeights) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = ConcreteUKF<Vector<T, 3>>(alpha,beta,kappa);
    ukf.computeWeights();
    
    ASSERT_FLOAT_EQ(2, ukf.gamma);
    ASSERT_FLOAT_EQ(1, ukf.lambda);
    
    ASSERT_FLOAT_EQ(0.25, ukf.sigmaWeights_m[0]);
    ASSERT_FLOAT_EQ(2.25, ukf.sigmaWeights_c[0]);
    
    for(size_t i = 1; i < 7; i++)
    {
        ASSERT_FLOAT_EQ(0.125, ukf.sigmaWeights_c[i]);
        ASSERT_FLOAT_EQ(0.125, ukf.sigmaWeights_m[i]);
    }
}